

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O0

void __thiscall
Eigen::
TriangularViewImpl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>const>const,2u,Eigen::Dense>
::solveInPlace<2,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
          (TriangularViewImpl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>const>const,2u,Eigen::Dense>
           *this,MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                 *_other)

{
  MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0> *this_00;
  TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_2U>
  *pTVar1;
  Index IVar2;
  Index IVar3;
  NestedExpression *lhs;
  bool bVar4;
  OtherCopy otherCopy;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *other;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *_other_local;
  TriangularViewImpl<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_2U,_Eigen::Dense>
  *this_local;
  
  this_00 = (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0> *)
            EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
            const_cast_derived((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                                *)_other);
  pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>_>
           ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_2U>_>
                      *)this);
  IVar2 = TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>
          ::cols(pTVar1);
  pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>_>
           ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_2U>_>
                      *)this);
  IVar3 = TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>
          ::rows(pTVar1);
  bVar4 = false;
  if (IVar2 == IVar3) {
    pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>_>
             ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_2U>_>
                        *)this);
    IVar2 = TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>
            ::cols(pTVar1);
    IVar3 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::cols
                      (this_00);
    bVar4 = IVar2 == IVar3;
  }
  if (bVar4) {
    pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>_>
             ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_2U>_>
                        *)this);
    IVar2 = TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>
            ::cols(pTVar1);
    if (IVar2 != 0) {
      pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>_>
               ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_2U>_>
                          *)this);
      lhs = TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_2U>
            ::nestedExpression(pTVar1);
      internal::
      triangular_solver_selector<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_2,_0,_-1>
      ::run(lhs,(Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)this_00);
    }
    return;
  }
  __assert_fail("derived().cols() == derived().rows() && ((Side==OnTheLeft && derived().cols() == other.rows()) || (Side==OnTheRight && derived().cols() == other.cols()))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/SolveTriangular.h"
                ,0xaa,
                "void Eigen::TriangularViewImpl<const Eigen::Transpose<const Eigen::Block<Eigen::Matrix<double, -1, -1>>>, 2, Eigen::Dense>::solveInPlace(const MatrixBase<OtherDerived> &) const [_MatrixType = const Eigen::Transpose<const Eigen::Block<Eigen::Matrix<double, -1, -1>>>, _Mode = 2, StorageKind = Eigen::Dense, Side = 2, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

void TriangularViewImpl<MatrixType,Mode,Dense>::solveInPlace(const MatrixBase<OtherDerived>& _other) const
{
  OtherDerived& other = _other.const_cast_derived();
  eigen_assert( derived().cols() == derived().rows() && ((Side==OnTheLeft && derived().cols() == other.rows()) || (Side==OnTheRight && derived().cols() == other.cols())) );
  eigen_assert((!(Mode & ZeroDiag)) && bool(Mode & (Upper|Lower)));
  // If solving for a 0x0 matrix, nothing to do, simply return.
  if (derived().cols() == 0)
    return;

  enum { copy = (internal::traits<OtherDerived>::Flags & RowMajorBit)  && OtherDerived::IsVectorAtCompileTime && OtherDerived::SizeAtCompileTime!=1};
  typedef typename internal::conditional<copy,
    typename internal::plain_matrix_type_column_major<OtherDerived>::type, OtherDerived&>::type OtherCopy;
  OtherCopy otherCopy(other);

  internal::triangular_solver_selector<MatrixType, typename internal::remove_reference<OtherCopy>::type,
    Side, Mode>::run(derived().nestedExpression(), otherCopy);

  if (copy)
    other = otherCopy;
}